

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall World::World(World *this,int sizee)

{
  (this->wumpus_location).first = 0;
  (this->wumpus_location).second = 0;
  (this->pit_locations).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pit_locations).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pit_locations).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gold_location).first = 0;
  (this->gold_location).second = 0;
  (this->boxes).
  super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->boxes).
  super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->boxes).
  super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->size = sizee;
  init_empty_world(this);
  generate_position(this);
  this->pos = 0;
  return;
}

Assistant:

World::World(int sizee)
{
    size = sizee;
    init_empty_world();
    generate_position();
    pos = 0;

    // check_percolaton();
}